

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended-kalman-filter.cpp
# Opt level: O2

Amatrix * __thiscall
stateObservation::ExtendedKalmanFilter::getAMatrixFD
          (Amatrix *__return_storage_ptr__,ExtendedKalmanFilter *this,Vector *dx)

{
  IndexedVector *this_00;
  Matrix<double,__1,_1,_0,__1,_1> *src;
  Amatrix *other;
  StateVector *dst;
  StateVector *this_01;
  double dVar1;
  Index IVar2;
  StateVectorArithmetics *pSVar3;
  double *pdVar4;
  TimeIndex time;
  Matrix<double,__1,_1,_0,__1,_1> *src_00;
  CoeffReturnType pdVar5;
  Scalar *pSVar6;
  Index i;
  long index;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_78;
  _func_int **local_40;
  
  this_00 = &(this->super_KalmanFilterBase).super_ZeroDelayObserver.x_;
  time = IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::getTime(this_00);
  other = &(this->opt).a_;
  IVar2 = (this->super_KalmanFilterBase).nt_;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&other->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,IVar2,IVar2);
  KalmanFilterBase::updateStatePrediction((KalmanFilterBase *)&stack0xffffffffffffffc0);
  free(local_40);
  IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::check_(this_00);
  src = &(this->super_KalmanFilterBase).super_ZeroDelayObserver.x_.v_;
  dst = &(this->opt).x_;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(dst,src);
  this_01 = &(this->opt).dx_;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (this->super_KalmanFilterBase).nt_);
  if (0 < (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.p_) {
    if (this->directInputStateProcessFeedthrough_ == true) {
      src_00 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
               ::operator[](&(this->super_KalmanFilterBase).super_ZeroDelayObserver.u_,time);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&(this->opt).u_,src_00);
    }
    else {
      (*(this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase._vptr_ObserverBase
        [0x1b])(&local_78,this);
      pdVar4 = (this->opt).u_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      (this->opt).u_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
           = local_78.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
             m_data;
      IVar2 = (this->opt).u_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      (this->opt).u_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
           = local_78.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
             m_rows.m_value;
      local_78.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           pdVar4;
      local_78.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
      m_value = IVar2;
      free(pdVar4);
    }
  }
  for (index = 0; index < (this->super_KalmanFilterBase).nt_; index = index + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_01);
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)dx,index);
    dVar1 = *pdVar5;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,index)
    ;
    *pSVar6 = dVar1;
    pSVar3 = (this->super_KalmanFilterBase).arithm_;
    IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::check_(this_00);
    (**pSVar3->_vptr_StateVectorArithmetics)(pSVar3,src,this_01,dst);
    (*this->f_->_vptr_DynamicalSystemFunctorBase[2])(&local_78,this->f_,dst,&this->opt,time);
    pdVar4 = (this->opt).xp_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    (this->opt).xp_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = local_78.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_data;
    IVar2 = (this->opt).xp_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows;
    (this->opt).xp_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = local_78.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_rows.m_value;
    local_78.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
         pdVar4;
    local_78.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
    m_value = IVar2;
    free(pdVar4);
    pSVar3 = (this->super_KalmanFilterBase).arithm_;
    IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::check_
              (&(this->super_KalmanFilterBase).xbar_);
    (*pSVar3->_vptr_StateVectorArithmetics[1])
              (pSVar3,&(this->opt).xp_,&(this->super_KalmanFilterBase).xbar_.v_,this_01);
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)dx,index);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_01,pdVar5);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              (&local_78,other,index);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&local_78,this_01);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,
             (DenseStorage<double,__1,__1,__1,_0> *)other);
  return __return_storage_ptr__;
}

Assistant:

KalmanFilterBase::Amatrix // ExtendedKalmanFilter<n,m,p>::Amatrix does not work
    ExtendedKalmanFilter::getAMatrixFD(const Vector & dx)
{
  TimeIndex k = this->x_.getTime();
  opt.a_.resize(nt_, nt_);
  updateStatePrediction();

  opt.x_ = this->x_();
  opt.dx_.resize(nt_);

  if(p_ > 0)
  {
    if(directInputStateProcessFeedthrough_)
      opt.u_ = this->u_[k];
    else
      opt.u_ = inputVectorZero();
  }

  for(Index i = 0; i < nt_; ++i)
  {

    opt.dx_.setZero();
    opt.dx_[i] = dx[i];

    arithm_->stateSum(this->x_(), opt.dx_, opt.x_);

    opt.xp_ = f_->stateDynamics(opt.x_, opt.u_, k);

    arithm_->stateDifference(opt.xp_, xbar_(), opt.dx_);

    opt.dx_ /= dx[i];

    opt.a_.col(i) = opt.dx_;
  }

  return opt.a_;
}